

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Region.hpp
# Opt level: O2

void __thiscall RegionDetector::Region::merge(Region *this,Region *other)

{
  uint __line;
  char *__assertion;
  
  if (other == (Region *)0x0) {
    __assertion = "other";
    __line = 0x4b;
  }
  else if (other->level == 0x100) {
    __assertion = "other->level != 256";
    __line = 0x4c;
  }
  else if (other->parent == (Region *)0x0) {
    if (other->next == (Region *)0x0) {
      this->intensitySum = this->intensitySum + other->intensitySum;
      other->next = this->child;
      this->child = other;
      other->parent = this;
      if (this->xMax < other->xMax) {
        this->xMax = other->xMax;
      }
      if (this->yMax < other->yMax) {
        this->yMax = other->yMax;
      }
      if (other->xMin < this->xMin || this->xMin == -1) {
        this->xMin = other->xMin;
      }
      if (other->yMin < this->yMin || this->yMin == -1) {
        this->yMin = other->yMin;
      }
      this->size = this->size + other->size;
      return;
    }
    __assertion = "other->next == nullptr";
    __line = 0x4e;
  }
  else {
    __assertion = "other->parent == nullptr";
    __line = 0x4d;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/schenker[P]RegionDetector/RegionDetector/Region.hpp"
                ,__line,"void RegionDetector::Region::merge(Region *)");
}

Assistant:

void merge(Region *other) {
			assert(other);
			assert(other->level != 256);
			assert(other->parent == nullptr);
			assert(other->next == nullptr);

			this->intensitySum += other->intensitySum;

			// insert as first child of other region
			other->next = this->child;
			this->child = other;
			other->parent = this;

			if (other->xMax > xMax) {
				xMax = other->xMax;
			}

			if (other->yMax > yMax) {
				yMax = other->yMax;
			}

			if (other->xMin < xMin || xMin == -1) {
				xMin = other->xMin;
			}

			if (other->yMin < yMin || yMin == -1) {
				yMin = other->yMin;
			}

			size += other->size;
		}